

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

void __thiscall ON_String::TrimRight(ON_String *this,char *s)

{
  char cVar1;
  char *pcVar2;
  ON_Internal_Empty_aString *pOVar3;
  ulong uVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar2 = this->m_s;
  pOVar3 = (ON_Internal_Empty_aString *)(pcVar2 + -0xc);
  if (pcVar2 == (char *)0x0) {
    pOVar3 = &empty_astring;
  }
  uVar4 = (ulong)(pOVar3->header).string_length;
  if ((long)uVar4 < 1) {
    return;
  }
  if (s == (char *)0x0) {
    do {
      if ((long)uVar4 < 1) goto LAB_005c1fa4;
      lVar6 = uVar4 - 1;
      uVar4 = uVar4 - 1;
    } while (('\0' < pcVar2[lVar6]) && (0x5d < (byte)(pcVar2[lVar6] - 0x21U)));
  }
  else {
    do {
      if ((long)uVar4 < 1) goto LAB_005c1fa4;
      uVar4 = uVar4 - 1;
      pcVar5 = s;
      if (pcVar2[uVar4] == '\0') break;
      do {
        cVar1 = *pcVar5;
        if (cVar1 == '\0') break;
        pcVar5 = pcVar5 + 1;
      } while (cVar1 != pcVar2[uVar4]);
    } while (cVar1 != '\0');
  }
LAB_005c1fa9:
  if (-1 < (int)uVar4) {
    if (pcVar2[(uVar4 & 0xffffffff) + 1] != '\0') {
      lVar6 = (uVar4 & 0xffffffff) + 1;
      CopyArray(this);
      this->m_s[lVar6] = '\0';
      pOVar3 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      if (this->m_s == (char *)0x0) {
        pOVar3 = &empty_astring;
      }
      (pOVar3->header).string_length = (int)lVar6;
    }
    return;
  }
  Destroy(this);
  return;
LAB_005c1fa4:
  uVar4 = 0xffffffff;
  goto LAB_005c1fa9;
}

Assistant:

ON_aStringHeader* ON_String::Header() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_astring.header;
  return hdr;
}